

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>::
decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
           *this,int32_t ra,int32_t rb)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  
  iVar3 = ra - rb;
  iVar6 = -iVar3;
  if (0 < iVar3) {
    iVar6 = iVar3;
  }
  if ((this->traits_).near_lossless < iVar6) {
    iVar4 = decode_run_interruption_error(this,(this->context_run_mode_)._M_elems);
    bVar1 = ra <= rb;
    iVar5 = -iVar4;
    ra = rb;
    if (bVar1) {
      iVar5 = iVar4;
    }
  }
  else {
    iVar5 = decode_run_interruption_error(this,(this->context_run_mode_)._M_elems + 1);
  }
  uVar2 = default_traits<unsigned_char,_unsigned_char>::fix_reconstructed_value
                    (&this->traits_,((this->traits_).near_lossless * 2 + 1) * iVar5 + ra);
  return uVar2;
}

Assistant:

sample_type decode_run_interruption_pixel(int32_t ra, int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{decode_run_interruption_error(context_run_mode_[1])};
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{decode_run_interruption_error(context_run_mode_[0])};
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }